

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

xmlChar * htmlParseName(htmlParserCtxtPtr ctxt)

{
  int *piVar1;
  byte bVar2;
  xmlParserInputPtr pxVar3;
  byte *name;
  xmlChar *pxVar4;
  int iVar5;
  byte *pbVar6;
  
  if ((ctxt->progressive == 0) &&
     (pxVar3 = ctxt->input, (long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserInputGrow(pxVar3,0xfa);
  }
  name = ctxt->input->cur;
  bVar2 = *name;
  if (((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) && (bVar2 != 0x5f)) && (bVar2 != 0x3a)) {
LAB_0014aea0:
    pxVar4 = htmlParseNameComplex(ctxt);
    return pxVar4;
  }
  iVar5 = -1;
  pbVar6 = name;
  while( true ) {
    pbVar6 = pbVar6 + 1;
    bVar2 = *pbVar6;
    if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
       ((0x32 < bVar2 - 0x2d || ((0x4000000002003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) == 0))))
    break;
    iVar5 = iVar5 + -1;
  }
  if (pbVar6 == ctxt->input->end) {
    pxVar4 = (xmlChar *)0x0;
  }
  else {
    if ((char)bVar2 < '\x01') goto LAB_0014aea0;
    pxVar4 = xmlDictLookup(ctxt->dict,name,-iVar5);
    pxVar3 = ctxt->input;
    pxVar3->cur = pbVar6;
    piVar1 = &pxVar3->col;
    *piVar1 = *piVar1 - iVar5;
  }
  return pxVar4;
}

Assistant:

static const xmlChar *
htmlParseName(htmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    const xmlChar *ret;
    int count = 0;

    GROW;

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    if (((*in >= 0x61) && (*in <= 0x7A)) ||
	((*in >= 0x41) && (*in <= 0x5A)) ||
	(*in == '_') || (*in == ':')) {
	in++;
	while (((*in >= 0x61) && (*in <= 0x7A)) ||
	       ((*in >= 0x41) && (*in <= 0x5A)) ||
	       ((*in >= 0x30) && (*in <= 0x39)) ||
	       (*in == '_') || (*in == '-') ||
	       (*in == ':') || (*in == '.'))
	    in++;

	if (in == ctxt->input->end)
	    return(NULL);

	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
	    ret = xmlDictLookup(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    return(ret);
	}
    }
    return(htmlParseNameComplex(ctxt));
}